

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlog.cxx
# Opt level: O2

string * zpsoe::zlog::get_current_date_abi_cxx11_(void)

{
  tm *__tp;
  string *in_RDI;
  allocator<char> local_71;
  time_t t;
  char buf [80];
  
  t = time((time_t *)0x0);
  __tp = localtime(&t);
  strftime(buf,0x50,"%Y-%m-%d %H:%M:%S",__tp);
  std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,buf,&local_71);
  return in_RDI;
}

Assistant:

string get_current_date() {
    char buf[80];
    time_t t = time(NULL);
    strftime(buf, 80, "%Y-%m-%d %H:%M:%S", localtime(&t));
    return string(buf);
}